

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_copy(mp_int *a,mp_int *b)

{
  int *in_RSI;
  int *in_RDI;
  mp_digit *tmpb;
  mp_digit *tmpa;
  int n;
  int res;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 *puVar1;
  mp_int *in_stack_ffffffffffffffd8;
  undefined8 *puVar2;
  int local_20;
  int local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else if ((*in_RDI <= in_RSI[1]) ||
          (local_4 = mp_grow(in_stack_ffffffffffffffd8,
                             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20)), local_4 == 0)) {
    puVar1 = *(undefined8 **)(in_RSI + 4);
    puVar2 = *(undefined8 **)(in_RDI + 4);
    for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
      *puVar1 = *puVar2;
      puVar1 = puVar1 + 1;
      puVar2 = puVar2 + 1;
    }
    for (; local_20 < *in_RSI; local_20 = local_20 + 1) {
      *puVar1 = 0;
      puVar1 = puVar1 + 1;
    }
    *in_RSI = *in_RDI;
    in_RSI[2] = in_RDI[2];
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_copy (mp_int * a, mp_int * b)
{
  int     res, n;

  /* if dst == src do nothing */
  if (a == b) {
    return MP_OKAY;
  }

  /* grow dest */
  if (b->alloc < a->used) {
     if ((res = mp_grow (b, a->used)) != MP_OKAY) {
        return res;
     }
  }

  /* zero b and copy the parameters over */
  {
    register mp_digit *tmpa, *tmpb;

    /* pointer aliases */

    /* source */
    tmpa = a->dp;

    /* destination */
    tmpb = b->dp;

    /* copy all the digits */
    for (n = 0; n < a->used; n++) {
      *tmpb++ = *tmpa++;
    }

    /* clear high digits */
    for (; n < b->used; n++) {
      *tmpb++ = 0;
    }
  }

  /* copy used count and sign */
  b->used = a->used;
  b->sign = a->sign;
  return MP_OKAY;
}